

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

NondegeneracyCheckResult * __thiscall
slang::ast::SequenceRepetition::checkNondegeneracy(SequenceRepetition *this)

{
  __optional_eq_t<unsigned_int,_unsigned_int> _Var1;
  long in_RSI;
  NondegeneracyCheckResult *in_RDI;
  bitmask<slang::ast::NondegeneracyStatus> res;
  uint *in_stack_ffffffffffffffc8;
  NondegeneracyCheckResult *this_00;
  bitmask<slang::ast::NondegeneracyStatus> local_18;
  undefined4 local_14;
  bitmask<slang::ast::NondegeneracyStatus> local_10;
  bitmask<slang::ast::NondegeneracyStatus> local_c [3];
  
  this_00 = in_RDI;
  bitmask<slang::ast::NondegeneracyStatus>::bitmask(local_c);
  if (*(int *)(in_RSI + 4) == 0) {
    bitmask<slang::ast::NondegeneracyStatus>::bitmask(&local_10,AdmitsEmpty);
    local_c[0].m_bits = local_10.m_bits;
    local_14 = 0;
    _Var1 = std::operator==((optional<unsigned_int> *)this_00,in_stack_ffffffffffffffc8);
    if (_Var1) {
      bitmask<slang::ast::NondegeneracyStatus>::bitmask(&local_18,AcceptsOnlyEmpty);
      bitmask<slang::ast::NondegeneracyStatus>::operator|=(local_c,&local_18);
    }
  }
  (this_00->status).m_bits = local_c[0].m_bits;
  SourceRange::SourceRange((SourceRange *)this_00);
  this_00->isAlwaysFalse = false;
  return in_RDI;
}

Assistant:

AssertionExpr::NondegeneracyCheckResult SequenceRepetition::checkNondegeneracy() const {
    bitmask<NondegeneracyStatus> res;
    if (range.min == 0u) {
        res = NondegeneracyStatus::AdmitsEmpty;
        if (range.max == 0u)
            res |= NondegeneracyStatus::AcceptsOnlyEmpty;
    }
    return {res, {}, false};
}